

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtCompoundLeafCallback::ProcessChildShape
          (cbtCompoundLeafCallback *this,cbtCollisionShape *childShape,int index)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  cbtCollisionShape *pcVar10;
  cbtTransform *pcVar11;
  void *pvVar12;
  cbtManifoldResult *pcVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  byte bVar18;
  bool bVar19;
  int iVar20;
  cbtCollisionObjectWrapper *pcVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  cbtVector3 aabbMin1;
  cbtCollisionObjectWrapper compoundWrap;
  cbtVector3 aabbMax1;
  undefined8 local_d8;
  float local_d0;
  float local_c8;
  float local_c4;
  float local_c0;
  cbtCollisionObjectWrapper *local_b8;
  cbtCollisionShape *local_b0;
  cbtCollisionObject *local_a8;
  undefined8 *local_a0;
  undefined4 local_98;
  int local_94;
  undefined8 local_90;
  float local_88;
  float local_80;
  float local_7c;
  float local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 local_40 [16];
  cbtCollisionAlgorithm *pcVar22;
  
  pcVar21 = this->m_compoundColObjWrap;
  pcVar10 = pcVar21->m_shape;
  if (gCompoundChildShapePairCallback != (cbtShapePairCallback)0x0) {
    bVar19 = (*gCompoundChildShapePairCallback)(this->m_otherObjWrap->m_shape,childShape);
    if (!bVar19) {
      return;
    }
    pcVar21 = this->m_compoundColObjWrap;
  }
  pcVar11 = pcVar21->m_worldTransform;
  pvVar12 = pcVar10[1].m_userPointer;
  lVar23 = (long)index;
  lVar24 = lVar23 * 0x58;
  fVar1 = (pcVar11->m_basis).m_el[0].m_floats[1];
  auVar27._4_4_ = fVar1;
  auVar27._0_4_ = fVar1;
  auVar27._8_4_ = fVar1;
  auVar27._12_4_ = fVar1;
  fVar2 = (pcVar11->m_basis).m_el[1].m_floats[1];
  auVar34._4_4_ = fVar2;
  auVar34._0_4_ = fVar2;
  auVar34._8_4_ = fVar2;
  auVar34._12_4_ = fVar2;
  fVar3 = (pcVar11->m_basis).m_el[2].m_floats[1];
  auVar28._4_4_ = fVar3;
  auVar28._0_4_ = fVar3;
  auVar28._8_4_ = fVar3;
  auVar28._12_4_ = fVar3;
  fVar4 = *(float *)((long)pvVar12 + lVar24 + 0x18);
  cVar5 = (pcVar11->m_basis).m_el[0].m_floats[0];
  auVar32._4_4_ = cVar5;
  auVar32._0_4_ = cVar5;
  auVar32._8_4_ = cVar5;
  auVar32._12_4_ = cVar5;
  cVar5 = (pcVar11->m_basis).m_el[1].m_floats[0];
  auVar35._4_4_ = cVar5;
  auVar35._0_4_ = cVar5;
  auVar35._8_4_ = cVar5;
  auVar35._12_4_ = cVar5;
  cVar5 = (pcVar11->m_basis).m_el[2].m_floats[0];
  auVar31._4_4_ = cVar5;
  auVar31._0_4_ = cVar5;
  auVar31._8_4_ = cVar5;
  auVar31._12_4_ = cVar5;
  uVar6 = *(uint *)((long)pvVar12 + lVar24 + 8);
  cVar5 = (pcVar11->m_basis).m_el[0].m_floats[2];
  auVar33._4_4_ = cVar5;
  auVar33._0_4_ = cVar5;
  auVar33._8_4_ = cVar5;
  auVar33._12_4_ = cVar5;
  cVar5 = (pcVar11->m_basis).m_el[1].m_floats[2];
  auVar36._4_4_ = cVar5;
  auVar36._0_4_ = cVar5;
  auVar36._8_4_ = cVar5;
  auVar36._12_4_ = cVar5;
  cVar5 = (pcVar11->m_basis).m_el[2].m_floats[2];
  auVar29._4_4_ = cVar5;
  auVar29._0_4_ = cVar5;
  auVar29._8_4_ = cVar5;
  auVar29._12_4_ = cVar5;
  uVar7 = *(uint *)((long)pvVar12 + lVar24 + 0x28);
  uVar8 = *(uint *)((long)pvVar12 + lVar24 + 0x38);
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar1)),ZEXT416(uVar6),auVar32);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar2)),ZEXT416(uVar6),auVar35);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar3)),auVar31,ZEXT416(uVar6));
  uVar6 = *(uint *)((long)pvVar12 + lVar24 + 0x30);
  auVar14 = vfmadd231ss_fma(auVar30,ZEXT416(uVar7),auVar33);
  auVar15 = vfmadd231ss_fma(auVar25,ZEXT416(uVar7),auVar36);
  auVar16 = vfmadd231ss_fma(auVar26,auVar29,ZEXT416(uVar7));
  fVar2 = *(float *)((long)pvVar12 + lVar24 + 0x34);
  auVar25 = vmulss_avx512f(auVar34,ZEXT416((uint)fVar2));
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar1)),ZEXT416(uVar6),auVar32);
  auVar26 = vfmadd231ss_avx512f(auVar25,ZEXT416(uVar6),auVar35);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar3)),auVar31,ZEXT416(uVar6));
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416(uVar8),auVar33);
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416(uVar8),auVar36);
  auVar26 = vaddss_avx512f(auVar26,ZEXT416((uint)(pcVar11->m_origin).m_floats[1]));
  auVar25 = vfmadd231ss_fma(auVar25,auVar29,ZEXT416(uVar8));
  uVar9 = *(ulong *)((long)pvVar12 + lVar24 + 0x10);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)((long)pvVar12 + lVar24 + 0x20);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar9;
  auVar27 = vmulps_avx512vl(auVar27,auVar39);
  auVar28 = vmulps_avx512vl(auVar28,auVar39);
  auVar30 = vinsertps_avx(ZEXT416((uint)(auVar30._0_4_ + (pcVar11->m_origin).m_floats[0])),auVar26,
                          0x10);
  local_40 = vinsertps_avx(auVar30,ZEXT416((uint)(auVar25._0_4_ + (pcVar11->m_origin).m_floats[2])),
                           0x28);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)((long)pvVar12 + lVar24);
  auVar30 = vfmadd231ps_fma(auVar27,auVar37,auVar32);
  auVar25 = vfmadd231ps_fma(auVar28,auVar37,auVar31);
  auVar30 = vfmadd231ps_fma(auVar30,auVar38,auVar33);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar9;
  auVar26 = vmulps_avx512vl(auVar34,auVar40);
  auVar25 = vfmadd231ps_fma(auVar25,auVar38,auVar29);
  auVar26 = vfmadd231ps_fma(auVar26,auVar37,auVar35);
  local_70 = vmovlps_avx(auVar30);
  local_68 = auVar14._0_4_;
  local_64 = 0;
  auVar30 = vfmadd231ps_fma(auVar26,auVar38,auVar36);
  local_60 = vmovlps_avx(auVar30);
  local_58 = auVar15._0_4_;
  local_54 = 0;
  local_50 = vmovlps_avx(auVar25);
  local_48 = auVar16._0_4_;
  local_44 = 0;
  (*childShape->_vptr_cbtCollisionShape[2])(childShape,&local_70,&local_90,&local_d8);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_90;
  fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
  auVar26._4_4_ = fVar1;
  auVar26._0_4_ = fVar1;
  auVar26._8_4_ = fVar1;
  auVar26._12_4_ = fVar1;
  auVar30 = vsubps_avx(auVar30,auVar26);
  local_90 = vmovlps_avx(auVar30);
  local_88 = local_88 - fVar1;
  auVar25._0_4_ = fVar1 + (float)local_d8;
  auVar25._4_4_ = fVar1 + (float)((ulong)local_d8 >> 0x20);
  auVar25._8_4_ = fVar1 + 0.0;
  auVar25._12_4_ = fVar1 + 0.0;
  local_d8 = vmovlps_avx(auVar25);
  local_d0 = fVar1 + local_d0;
  pcVar10 = this->m_otherObjWrap->m_shape;
  (*pcVar10->_vptr_cbtCollisionShape[2])
            (pcVar10,this->m_otherObjWrap->m_worldTransform,&local_c8,&local_80);
  bVar18 = 1;
  if ((float)local_90 <= local_80) {
    bVar18 = 1;
    if (local_c8 <= (float)local_d8) {
      bVar18 = 0;
    }
  }
  bVar17 = 1;
  if ((local_88 <= local_78) && (local_c0 <= local_d0)) {
    bVar17 = bVar18;
  }
  if ((local_90._4_4_ <= local_7c) && (!(bool)(bVar17 | local_d8._4_4_ < local_c4))) {
    local_b8 = this->m_compoundColObjWrap;
    local_a8 = local_b8->m_collisionObject;
    local_98 = 0xffffffff;
    fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
    local_b0 = childShape;
    local_a0 = &local_70;
    local_94 = index;
    if (fVar1 <= 0.0) {
      pcVar22 = this->m_childCollisionAlgorithms[lVar23];
      if (pcVar22 == (cbtCollisionAlgorithm *)0x0) {
        iVar20 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                           (this->m_dispatcher,&local_b8,this->m_otherObjWrap,this->m_sharedManifold
                            ,1);
        this->m_childCollisionAlgorithms[lVar23] =
             (cbtCollisionAlgorithm *)CONCAT44(extraout_var_00,iVar20);
        pcVar22 = this->m_childCollisionAlgorithms[lVar23];
      }
    }
    else {
      iVar20 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                         (this->m_dispatcher,&local_b8,this->m_otherObjWrap,0,2);
      pcVar22 = (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar20);
    }
    pcVar13 = this->m_resultOut;
    pcVar21 = pcVar13->m_body0Wrap;
    if (pcVar21->m_collisionObject == this->m_compoundColObjWrap->m_collisionObject) {
      lVar23 = 0x10;
    }
    else {
      pcVar21 = pcVar13->m_body1Wrap;
      lVar23 = 0x18;
    }
    *(cbtCollisionObjectWrapper ***)((long)&(pcVar13->super_Result)._vptr_Result + lVar23) =
         &local_b8;
    (**(code **)((long)(pcVar13->super_Result)._vptr_Result + lVar23))(pcVar13,0xffffffff,index);
    (*pcVar22->_vptr_cbtCollisionAlgorithm[2])
              (pcVar22,&local_b8,this->m_otherObjWrap,this->m_dispatchInfo,this->m_resultOut);
    (&this->m_resultOut->m_body0Wrap)
    [this->m_resultOut->m_body0Wrap->m_collisionObject !=
     this->m_compoundColObjWrap->m_collisionObject] = pcVar21;
    if (0.0 < fVar1) {
      (**pcVar22->_vptr_cbtCollisionAlgorithm)(pcVar22);
      (*this->m_dispatcher->_vptr_cbtDispatcher[0xf])(this->m_dispatcher,pcVar22);
    }
  }
  return;
}

Assistant:

void ProcessChildShape(const cbtCollisionShape* childShape, int index)
	{
		cbtAssert(index >= 0);
		const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		cbtAssert(index < compoundShape->getNumChildShapes());

		if (gCompoundChildShapePairCallback)
		{
			if (!gCompoundChildShapePairCallback(m_otherObjWrap->getCollisionShape(), childShape))
				return;
		}

		//backup
		cbtTransform orgTrans = m_compoundColObjWrap->getWorldTransform();

		const cbtTransform& childTrans = compoundShape->getChildTransform(index);
		cbtTransform newChildWorldTrans = orgTrans * childTrans;

		//perform an AABB check first
		cbtVector3 aabbMin0, aabbMax0;
		childShape->getAabb(newChildWorldTrans, aabbMin0, aabbMax0);

		cbtVector3 extendAabb(m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold);
		aabbMin0 -= extendAabb;
		aabbMax0 += extendAabb;

		cbtVector3 aabbMin1, aabbMax1;
		m_otherObjWrap->getCollisionShape()->getAabb(m_otherObjWrap->getWorldTransform(), aabbMin1, aabbMax1);


		if (TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
		{
			cbtCollisionObjectWrapper compoundWrap(this->m_compoundColObjWrap, childShape, m_compoundColObjWrap->getCollisionObject(), newChildWorldTrans, -1, index);

			cbtCollisionAlgorithm* algo = 0;
			bool allocatedAlgorithm = false;

			if (m_resultOut->m_closestPointDistanceThreshold > 0)
			{
				algo = m_dispatcher->findAlgorithm(&compoundWrap, m_otherObjWrap, 0, BT_CLOSEST_POINT_ALGORITHMS);
				allocatedAlgorithm = true;
			}
			else
			{
				//the contactpoint is still projected back using the original inverted worldtrans
				if (!m_childCollisionAlgorithms[index])
				{
					m_childCollisionAlgorithms[index] = m_dispatcher->findAlgorithm(&compoundWrap, m_otherObjWrap, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);
				}
				algo = m_childCollisionAlgorithms[index];
			}

			const cbtCollisionObjectWrapper* tmpWrap = 0;

			///detect swapping case
			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				tmpWrap = m_resultOut->getBody0Wrap();
				m_resultOut->setBody0Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersA(-1, index);
			}
			else
			{
				tmpWrap = m_resultOut->getBody1Wrap();
				m_resultOut->setBody1Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersB(-1, index);
			}

			algo->processCollision(&compoundWrap, m_otherObjWrap, m_dispatchInfo, m_resultOut);

#if 0
			if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & cbtIDebugDraw::DBG_DrawAabb))
			{
				cbtVector3 worldAabbMin,worldAabbMax;
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin0,aabbMax0,cbtVector3(1,1,1));
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin1,aabbMax1,cbtVector3(1,1,1));
			}
#endif

			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				m_resultOut->setBody0Wrap(tmpWrap);
			}
			else
			{
				m_resultOut->setBody1Wrap(tmpWrap);
			}
			if (allocatedAlgorithm)
			{
				algo->~cbtCollisionAlgorithm();
				m_dispatcher->freeCollisionAlgorithm(algo);
			}
		}
	}